

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::assign
          (CImg<unsigned_int> *this,uint *values,uint size_x,uint size_y,uint size_z,uint size_c,
          bool is_shared)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  long lVar6;
  ulongT uVar7;
  char *pcVar8;
  char *pcVar9;
  size_t siz;
  bool is_shared_local;
  uint size_c_local;
  uint size_z_local;
  uint size_y_local;
  uint size_x_local;
  uint *values_local;
  CImg<unsigned_int> *this_local;
  
  lVar6 = (ulong)size_x * (ulong)size_y * (ulong)size_z * (ulong)size_c;
  if ((values == (uint *)0x0) || (lVar6 == 0)) {
    this_local = assign(this);
  }
  else {
    this_local = this;
    if (is_shared) {
      if ((this->_is_shared & 1U) == 0) {
        if ((values + lVar6 < this->_data) ||
           (puVar5 = this->_data, uVar7 = size(this), puVar5 + uVar7 <= values)) {
          assign(this);
        }
        else {
          uVar1 = this->_width;
          uVar2 = this->_height;
          uVar3 = this->_depth;
          uVar4 = this->_spectrum;
          puVar5 = this->_data;
          pcVar8 = "non-";
          if ((this->_is_shared & 1U) != 0) {
            pcVar8 = "";
          }
          pcVar9 = pixel_type();
          cimg::warn("[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::assign(): Shared image instance has overlapping memory."
                     ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar8,pcVar9);
        }
      }
      this->_width = size_x;
      this->_height = size_y;
      this->_depth = size_z;
      this->_spectrum = size_c;
      this->_is_shared = true;
      this->_data = values;
    }
    else {
      if ((this->_is_shared & 1U) != 0) {
        assign(this);
      }
      assign(this,values,size_x,size_y,size_z,size_c);
    }
  }
  return this_local;
}

Assistant:

CImg<T>& assign(const T *const values, const unsigned int size_x, const unsigned int size_y,
                    const unsigned int size_z, const unsigned int size_c, const bool is_shared) {
      const size_t siz = (size_t)size_x*size_y*size_z*size_c;
      if (!values || !siz) return assign();
      if (!is_shared) { if (_is_shared) assign(); assign(values,size_x,size_y,size_z,size_c); }
      else {
	if (!_is_shared) {
	  if (values + siz<_data || values>=_data + size()) assign();
	  else cimg::warn(_cimg_instance
                          "assign(): Shared image instance has overlapping memory.",
                          cimg_instance);
	}
	_width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c; _is_shared = true;
	_data = const_cast<T*>(values);
      }
      return *this;
    }